

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

void __thiscall Iex_3_4::BaseExc::BaseExc(BaseExc *this,BaseExc *be)

{
  *(undefined ***)this = &PTR__EnotenqueuedExc_00173618;
  std::__cxx11::string::string((string *)&this->_message,(string *)&be->_message);
  std::__cxx11::string::string((string *)&this->_stackTrace,(string *)&be->_stackTrace);
  return;
}

Assistant:

BaseExc::BaseExc (const BaseExc& be)
    : _message (be._message), _stackTrace (be._stackTrace)
{}